

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureMemoryRegistry.cpp
# Opt level: O0

void __thiscall SecureMemoryRegistry::wipe(SecureMemoryRegistry *this)

{
  unsigned_long uVar1;
  bool bVar2;
  pointer ppVar3;
  iterator i;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  MutexLocker *in_stack_ffffffffffffffa0;
  _Self *this_00;
  _Self local_28;
  _Self local_20 [4];
  
  MutexLocker::MutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::begin((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff98);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
         ::end((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff98);
    bVar2 = std::operator!=(local_20,&local_28);
    if (!bVar2) break;
    this_00 = local_20;
    ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x13f9fe);
    uVar1 = ppVar3->second;
    ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x13fa11);
    in_stack_ffffffffffffff98 = (Mutex *)ppVar3->first;
    softHSMLog(7,"wipe",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureMemoryRegistry.cpp"
               ,0x76,"Wiping block of %d bytes at 0x%x",uVar1);
    ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x13fa74);
    in_stack_ffffffffffffffa0 = (MutexLocker *)ppVar3->first;
    ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x13fa86);
    memset(in_stack_ffffffffffffffa0,0,ppVar3->second);
    std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator++
              (this_00,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  MutexLocker::~MutexLocker(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void SecureMemoryRegistry::wipe()
{
	MutexLocker lock(SecMemRegistryMutex);

	// Be very careful in this method to catch any weird exceptions that
	// may occur since if we're in this method it means something has already
	// gone pear shaped once before and we're exiting on a fatal exception
	try
	{
		for (std::map<void*, size_t>::iterator i = registry.begin(); i != registry.end(); i++)
		{
			try
			{
				DEBUG_MSG("Wiping block of %d bytes at 0x%x", i->second, i->first);
			}
			catch (...)
			{
			}
	
			try
			{
	#ifdef PARANOID
				memset(i->first, 0xFF, i->second);
	#endif // PARANOID
				memset(i->first, 0x00, i->second);
			}
			catch (...)
			{
				ERROR_MSG("Failed to wipe block of %d bytes at 0x%x", i->second, i->first);
			}
		}
	}
	catch (...)
	{
		ERROR_MSG("Failed to enumerate the secure memory registry");
	}
}